

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type *x)

{
  path *ppVar1;
  undefined1 local_28 [8];
  basic_string_view<char,_std::char_traits<char>_> part;
  value_type *x_local;
  path *this_local;
  
  part._M_str = x;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_28,x);
  ppVar1 = concat<std::basic_string_view<char,std::char_traits<char>>>
                     (this,(basic_string_view<char,_std::char_traits<char>_> *)local_28);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator+=(const value_type* x)
{
#ifdef GHC_WITH_STRING_VIEW
    basic_string_view<value_type> part(x);
#else
    string_type part(x);
#endif
    return concat(part);
}